

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http1client.c
# Opt level: O2

void on_body_until_close(h2o_socket_t *sock,char *err)

{
  st_h2o_http1client_private_t *client;
  h2o_http1client_ctx_t *phVar1;
  h2o_http1client_head_cb p_Var2;
  size_t *in_RCX;
  h2o_iovec_t **extraout_RDX;
  int *in_R8;
  
  client = (st_h2o_http1client_private_t *)sock->data;
  h2o_timeout_unlink(&client->_timeout);
  if (err != (char *)0x0) {
    (*(client->_cb).on_connect)
              ((h2o_http1client_t *)client,"end of stream",extraout_RDX,in_RCX,in_R8);
LAB_0012b4f1:
    close_client(client);
    return;
  }
  if (sock->bytes_read != 0) {
    p_Var2 = (*(client->_cb).on_connect)
                       ((h2o_http1client_t *)client,(char *)0x0,extraout_RDX,in_RCX,in_R8);
    if ((int)p_Var2 != 0) goto LAB_0012b4f1;
  }
  phVar1 = (client->super).ctx;
  h2o_timeout_link(phVar1->loop,phVar1->io_timeout,&client->_timeout);
  return;
}

Assistant:

static void on_body_until_close(h2o_socket_t *sock, const char *err)
{
    struct st_h2o_http1client_private_t *client = sock->data;

    h2o_timeout_unlink(&client->_timeout);

    if (err != NULL) {
        client->_cb.on_body(&client->super, h2o_http1client_error_is_eos);
        close_client(client);
        return;
    }

    if (sock->bytes_read != 0) {
        if (client->_cb.on_body(&client->super, NULL) != 0) {
            close_client(client);
            return;
        }
    }

    h2o_timeout_link(client->super.ctx->loop, client->super.ctx->io_timeout, &client->_timeout);
}